

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *directory,FilePath *base_name,int number,char *extension)

{
  int in_ECX;
  FilePath *in_RDX;
  FilePath *in_RDI;
  char *in_R8;
  string file;
  string *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8 [8];
  FilePath *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [32];
  char *local_28;
  int local_1c;
  FilePath *local_18;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_48);
  if (local_1c == 0) {
    in_stack_fffffffffffffe90 = string_abi_cxx11_(local_18);
    std::operator+(&local_88,in_stack_fffffffffffffe90,".");
    std::operator+(&local_68,&local_88,local_28);
    std::__cxx11::string::operator=(local_48,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    in_stack_fffffffffffffe88 = string_abi_cxx11_(local_18);
    std::operator+(&local_118,in_stack_fffffffffffffe88,"_");
    StreamableToString<int>(in_stack_fffffffffffffea8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   &local_118,&local_138);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,"."
                  );
    std::operator+(&local_b8,&local_d8,local_28);
    std::__cxx11::string::operator=(local_48,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
  }
  FilePath((FilePath *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ConcatPaths((FilePath *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  ~FilePath((FilePath *)0x1a5069);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}